

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRepr.c
# Opt level: O0

Aig_Man_t * Aig_ManDupRepr(Aig_Man_t *p,int fOrdered)

{
  int iVar1;
  Aig_Man_t *p_00;
  char *pcVar2;
  Vec_Int_t *pVVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  void *pvVar6;
  Aig_Obj_t *p1;
  int local_2c;
  int i;
  Aig_Obj_t *pObj;
  Aig_Man_t *pNew;
  int fOrdered_local;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ManObjNumMax(p);
  p_00 = Aig_ManStart(iVar1);
  pcVar2 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar2;
  pcVar2 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar2;
  p_00->nConstrs = p->nConstrs;
  p_00->nBarBufs = p->nBarBufs;
  if (p->vFlopNums != (Vec_Int_t *)0x0) {
    pVVar3 = Vec_IntDup(p->vFlopNums);
    p_00->vFlopNums = pVVar3;
  }
  Aig_ManCleanData(p);
  pAVar4 = Aig_ManConst1(p_00);
  pAVar5 = Aig_ManConst1(p);
  (pAVar5->field_5).pData = pAVar4;
  for (local_2c = 0; iVar1 = Vec_PtrSize(p->vCis), local_2c < iVar1; local_2c = local_2c + 1) {
    pvVar6 = Vec_PtrEntry(p->vCis,local_2c);
    pAVar4 = Aig_ObjCreateCi(p_00);
    *(Aig_Obj_t **)((long)pvVar6 + 0x28) = pAVar4;
  }
  if (fOrdered == 0) {
    for (local_2c = 0; iVar1 = Vec_PtrSize(p->vCos), local_2c < iVar1; local_2c = local_2c + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,local_2c);
      pAVar4 = Aig_ObjFanin0(pAVar4);
      Aig_ManDupRepr_rec(p_00,p,pAVar4);
    }
  }
  else {
    for (local_2c = 0; iVar1 = Vec_PtrSize(p->vObjs), local_2c < iVar1; local_2c = local_2c + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_2c);
      if ((pAVar4 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar4), iVar1 != 0)) {
        pAVar5 = Aig_ObjChild0Repr(p,pAVar4);
        p1 = Aig_ObjChild1Repr(p,pAVar4);
        pAVar5 = Aig_And(p_00,pAVar5,p1);
        (pAVar4->field_5).pData = pAVar5;
      }
    }
  }
  for (local_2c = 0; iVar1 = Vec_PtrSize(p->vCos), local_2c < iVar1; local_2c = local_2c + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,local_2c);
    pAVar4 = Aig_ObjChild0Repr(p,pAVar4);
    Aig_ObjCreateCo(p_00,pAVar4);
  }
  iVar1 = Aig_ManRegNum(p);
  Aig_ManSetRegNum(p_00,iVar1);
  iVar1 = Aig_ManCheck(p_00);
  if (iVar1 == 0) {
    printf("Aig_ManDupRepr: Check has failed.\n");
  }
  return p_00;
}

Assistant:

Aig_Man_t * Aig_ManDupRepr( Aig_Man_t * p, int fOrdered )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj;
    int i;
    // start the HOP package
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->nConstrs = p->nConstrs;
    pNew->nBarBufs = p->nBarBufs;
    if ( p->vFlopNums )
        pNew->vFlopNums = Vec_IntDup( p->vFlopNums );
    // map the const and primary inputs
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p, pObj, i )
        pObj->pData = Aig_ObjCreateCi(pNew);
//    Aig_ManForEachCi( p, pObj, i )
//        pObj->pData = Aig_ObjGetRepr( p, pObj );
    // map the internal nodes
    if ( fOrdered )
    {
        Aig_ManForEachNode( p, pObj, i )
            pObj->pData = Aig_And( pNew, Aig_ObjChild0Repr(p, pObj), Aig_ObjChild1Repr(p, pObj) );
    }
    else
    {
//        Aig_ManForEachObj( p, pObj, i )
//            if ( p->pReprs[i] )
//                printf( "Substituting %d for %d.\n", p->pReprs[i]->Id, pObj->Id );

        Aig_ManForEachCo( p, pObj, i )
            Aig_ManDupRepr_rec( pNew, p, Aig_ObjFanin0(pObj) );
    }
    // transfer the POs
    Aig_ManForEachCo( p, pObj, i )
        Aig_ObjCreateCo( pNew, Aig_ObjChild0Repr(p, pObj) );
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    // check the new manager
    if ( !Aig_ManCheck(pNew) )
        printf( "Aig_ManDupRepr: Check has failed.\n" );
    return pNew;
}